

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_socket_comm.c
# Opt level: O2

TPM_SOCKET_HANDLE tpm_socket_create(char *address,unsigned_short port)

{
  int __fd;
  int iVar1;
  TPM_SOCKET_HANDLE __ptr;
  LOGGER_LOG p_Var2;
  sockaddr local_38;
  
  __ptr = (TPM_SOCKET_HANDLE)calloc(1,0x18);
  if (__ptr == (TPM_SOCKET_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                ,"tpm_socket_create",0xcc,1,"Failure: malloc socket communication info.");
      return (TPM_SOCKET_HANDLE)0x0;
    }
  }
  else {
    __fd = socket(2,1,0);
    __ptr->socket_conn = __fd;
    if (__fd == -1) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                  ,"tpm_socket_create",0xd9,1,"Failure: connecting to tpm simulator.");
      }
    }
    else {
      local_38.sa_data[6] = '\0';
      local_38.sa_data[7] = '\0';
      local_38.sa_data[8] = '\0';
      local_38.sa_data[9] = '\0';
      local_38.sa_data[10] = '\0';
      local_38.sa_data[0xb] = '\0';
      local_38.sa_data[0xc] = '\0';
      local_38.sa_data[0xd] = '\0';
      local_38.sa_family = 2;
      local_38.sa_data._0_2_ = port << 8 | port >> 8;
      local_38.sa_data._2_4_ = inet_addr(address);
      iVar1 = connect(__fd,&local_38,0x10);
      if (-1 < iVar1) {
        return __ptr;
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                  ,"tpm_socket_create",0xe7,1,"Failure: connecting to tpm simulator.");
      }
      close_socket(__fd);
    }
    free(__ptr);
  }
  return (TPM_SOCKET_HANDLE)0x0;
}

Assistant:

TPM_SOCKET_HANDLE tpm_socket_create(const char* address, unsigned short port)
{
    TPM_SOCKET_INFO* result;
    if ((result = malloc(sizeof(TPM_SOCKET_INFO))) == NULL)
    {
        LogError("Failure: malloc socket communication info.");
    }
    else
    {
#ifdef WIN32
        WSADATA wsaData;
        WSAStartup(MAKEWORD(2, 0), &wsaData);
#endif

        memset(result, 0, sizeof(TPM_SOCKET_INFO));

        if ((result->socket_conn = socket(AF_INET, SOCK_STREAM, 0)) == INVALID_SOCKET)
        {
            LogError("Failure: connecting to tpm simulator.");
            free(result);
            result = NULL;
        }
        else
        {
            struct sockaddr_in SockAddr;
            memset(&SockAddr, 0, sizeof(SockAddr));
            SockAddr.sin_family = AF_INET;
            SockAddr.sin_port = htons(port);
            SockAddr.sin_addr.s_addr = inet_addr(address);

            if (connect(result->socket_conn, (struct sockaddr*)&SockAddr, sizeof(SockAddr)) < 0)
            {
                LogError("Failure: connecting to tpm simulator.");
                close_socket(result->socket_conn);
                free(result);
                result = NULL;
            }
        }
    }
    return result;
}